

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> *
FromBytes(span<const_std::byte,_18446744073709551615UL> source)

{
  element_type eVar1;
  long lVar2;
  size_type sVar3;
  reference peVar4;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  long in_FS_OFFSET;
  reference rVar5;
  int bit_i;
  uint8_t cur_byte;
  int byte_i;
  int vector_size;
  vector<bool,_std::allocator<bool>_> *result;
  span<const_std::byte,_18446744073709551615UL> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  _Bit_reference *in_stack_ffffffffffffff68;
  undefined4 local_60;
  undefined4 local_58;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::span<const_std::byte,_18446744073709551615UL>::size(in_stack_ffffffffffffff58);
  std::allocator<bool>::allocator((allocator<bool> *)in_stack_ffffffffffffff58);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (size_type)in_stack_ffffffffffffff58,(allocator_type *)0x3115d3);
  std::allocator<bool>::~allocator((allocator<bool> *)in_stack_ffffffffffffff58);
  for (local_58 = 0; local_58 < ((int)sVar3 << 3) / 8; local_58 = local_58 + 1) {
    peVar4 = std::span<const_std::byte,_18446744073709551615UL>::operator[]
                       ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffff68,
                        CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    eVar1 = *peVar4;
    for (local_60 = 0; (int)local_60 < 8; local_60 = local_60 + 1) {
      in_stack_ffffffffffffff67 = (eVar1 >> (local_60 & 0x1f) & 1) != 0;
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff68,
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      in_stack_ffffffffffffff68 = (_Bit_reference *)rVar5._M_mask;
      std::_Bit_reference::operator=(in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static std::vector<bool> FromBytes(std::span<const std::byte> source)
{
    int vector_size(source.size() * 8);
    std::vector<bool> result(vector_size);
    for (int byte_i = 0; byte_i < vector_size / 8; ++byte_i) {
        uint8_t cur_byte{std::to_integer<uint8_t>(source[byte_i])};
        for (int bit_i = 0; bit_i < 8; ++bit_i) {
            result[byte_i * 8 + bit_i] = (cur_byte >> bit_i) & 1;
        }
    }
    return result;
}